

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

error_code __thiscall
simdjson::westmere::dom_parser_implementation::set_max_depth
          (dom_parser_implementation *this,size_t max_depth)

{
  pointer __p;
  pointer __p_00;
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  
  __p = (pointer)operator_new__(-(ulong)(max_depth >> 0x3d != 0) | max_depth * 8,
                                (nothrow_t *)&std::nothrow);
  std::
  __uniq_ptr_impl<simdjson::westmere::open_container,_std::default_delete<simdjson::westmere::open_container[]>_>
  ::reset((__uniq_ptr_impl<simdjson::westmere::open_container,_std::default_delete<simdjson::westmere::open_container[]>_>
           *)&this->open_containers,__p);
  __p_00 = (pointer)operator_new__(max_depth,(nothrow_t *)&std::nothrow);
  std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
            ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)&this->is_array,__p_00);
  bVar2 = (this->is_array)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl == (bool *)0x0;
  bVar3 = (this->open_containers)._M_t.
          super___uniq_ptr_impl<simdjson::westmere::open_container,_std::default_delete<simdjson::westmere::open_container[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_simdjson::westmere::open_container_*,_std::default_delete<simdjson::westmere::open_container[]>_>
          .super__Head_base<0UL,_simdjson::westmere::open_container_*,_false>._M_head_impl ==
          (open_container *)0x0;
  sVar1 = 0;
  if (!bVar3 && !bVar2) {
    sVar1 = max_depth;
  }
  (this->super_dom_parser_implementation)._max_depth = sVar1;
  return (uint)(bVar3 || bVar2) * 2;
}

Assistant:

inline simdjson_warn_unused error_code dom_parser_implementation::set_max_depth(size_t max_depth) noexcept {
  // Stage 2 stacks
  open_containers.reset(new (std::nothrow) open_container[max_depth]);
  is_array.reset(new (std::nothrow) bool[max_depth]);
  if (!is_array || !open_containers) { _max_depth = 0; return MEMALLOC; }

  _max_depth = max_depth;
  return SUCCESS;
}